

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<unsigned_long,int,int>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,unsigned_long param,int params,int params_1)

{
  string *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  value_type *in_stack_ffffffffffffff68;
  string *this;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  ExceptionFormatValue::CreateFormatValue<unsigned_long>((unsigned_long)in_stack_ffffffffffffff68);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            this,in_stack_ffffffffffffff68);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x704eb7);
  ConstructMessageRecursive<int,int>
            ((string *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}